

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreeTypeFaceWrapper.cpp
# Opt level: O3

FT_Short __thiscall
FreeTypeFaceWrapper::GetInPDFMeasurements(FreeTypeFaceWrapper *this,FT_Short inFontMeasurement)

{
  ushort uVar1;
  
  if (this->mFace != (FT_Face)0x0) {
    uVar1 = this->mFace->units_per_EM;
    if (uVar1 != 1000) {
      inFontMeasurement = (FT_Short)(int)(((double)(int)inFontMeasurement * 1000.0) / (double)uVar1)
      ;
    }
    return inFontMeasurement;
  }
  return 0;
}

Assistant:

FT_Short FreeTypeFaceWrapper::GetInPDFMeasurements(FT_Short inFontMeasurement)
{
	if(mFace)
	{
		if(1000 == mFace->units_per_EM)
			return inFontMeasurement;
		else
			return FT_Short((double)inFontMeasurement * 1000.0 / mFace->units_per_EM);
	}
	else
		return 0;
}